

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory *pTVar2;
  Bool BVar3;
  int iVar4;
  uint uVar5;
  Node *pNVar6;
  uint code;
  Node **ppNVar7;
  GetTokenMode mode_00;
  Node *pNVar8;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  if (element != (Node *)0x0) {
    BVar3 = prvTidyXMLPreserveWhiteSpace(doc,element);
    mode_00 = Preformatted;
    if (BVar3 == no) {
      mode_00 = mode;
    }
    InsertMisc(&doc->root,element);
    BVar3 = prvTidynodeIsText(element);
    if (BVar3 != no) {
      prvTidyReport(doc,&doc->root,element,0x235);
      prvTidyFreeNode(doc,element);
      return (Node *)0x0;
    }
    goto LAB_0013ff5b;
  }
  uVar5 = (doc->stack).top;
  pTVar2 = (doc->stack).content;
  element = pTVar2[uVar5].original_node;
  pNVar6 = pTVar2[uVar5].reentry_node;
  mode_00 = pTVar2[uVar5].reentry_mode;
  (doc->stack).top = uVar5 - 1;
  pNVar6->parent = element;
  if (element == (Node *)0x0) {
    pNVar6->prev = (Node *)0x0;
LAB_0013ff46:
    if (element == (Node *)0x0) goto LAB_0013ff5b;
    ppNVar7 = &element->content;
  }
  else {
    pNVar8 = element->last;
    pNVar6->prev = pNVar8;
    if (pNVar8 == (Node *)0x0) goto LAB_0013ff46;
    ppNVar7 = &pNVar8->next;
  }
  *ppNVar7 = pNVar6;
  if (element != (Node *)0x0) {
    element->last = pNVar6;
  }
LAB_0013ff5b:
  pNVar6 = prvTidyGetToken(doc,mode_00);
  do {
    if (pNVar6 == (Node *)0x0) {
LAB_00140027:
      pNVar6 = element->content;
      BVar3 = prvTidynodeIsText(pNVar6);
      if (((mode_00 != Preformatted) && (BVar3 != no)) &&
         ((pLVar1->lexbuf[pNVar6->start] == ' ' &&
          (uVar5 = pNVar6->start + 1, pNVar6->start = uVar5, pNVar6->end <= uVar5)))) {
        prvTidyDiscardElement(doc,pNVar6);
      }
      pNVar6 = element->last;
      BVar3 = prvTidynodeIsText(pNVar6);
      if (((mode_00 != Preformatted) && (BVar3 != no)) &&
         ((uVar5 = pNVar6->end - 1, pLVar1->lexbuf[uVar5] == ' ' &&
          (pNVar6->end = uVar5, uVar5 <= pNVar6->start)))) {
        prvTidyDiscardElement(doc,pNVar6);
      }
      return (Node *)0x0;
    }
    if ((((pNVar6->type == EndTag) && (pNVar6->element != (ctmbstr)0x0)) &&
        (element->element != (ctmbstr)0x0)) &&
       (iVar4 = prvTidytmbstrcmp(pNVar6->element,element->element), iVar4 == 0)) {
      prvTidyFreeNode(doc,pNVar6);
      element->closed = yes;
      goto LAB_00140027;
    }
    if (pNVar6->type == EndTag) {
      if (element == (Node *)0x0) {
        pNVar8 = (Node *)0x0;
        code = 0x285;
      }
      else {
        code = 0x286;
        pNVar8 = element;
      }
      prvTidyReport(doc,pNVar8,pNVar6,code);
      prvTidyFreeNode(doc,pNVar6);
    }
    else {
      if (pNVar6->type == StartTag) {
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT2848(CONCAT424(mode_00,CONCAT816(pNVar6,CONCAT88(element,
                                                  ParseXMLElement)))));
        return pNVar6;
      }
      pNVar6->parent = element;
      if (element == (Node *)0x0) {
        pNVar6->prev = (Node *)0x0;
LAB_00140004:
        if (element == (Node *)0x0) goto LAB_00140011;
        element->content = pNVar6;
      }
      else {
        pNVar8 = element->last;
        pNVar6->prev = pNVar8;
        if (pNVar8 == (Node *)0x0) goto LAB_00140004;
        pNVar8->next = pNVar6;
        if (element == (Node *)0x0) goto LAB_00140011;
      }
      element->last = pNVar6;
    }
LAB_00140011:
    pNVar6 = prvTidyGetToken(doc,mode_00);
  } while( true );
}

Assistant:

static Node* ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        element = memory.original_node;
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        mode = memory.reentry_mode;
        TY_(InsertNodeAtEnd)(element, node); /* The only re-entry action needed. */
    }
    else
    {
        /* if node is pre or has xml:space="preserve" then do so */
        if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
            mode = Preformatted;

        /* deal with comments etc. */
        InsertMisc( &doc->root, element);
        
        /* we shouldn't have plain text at this point. */
        if (TY_(nodeIsText)(element))
        {
            TY_(Report)(doc, &doc->root, element, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, element);
            return NULL;
        }
    }
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_ERR);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
        {
            TidyParserMemory memory = {0};
            memory.identity = ParseXMLElement;
            memory.original_node = element;
            memory.reentry_node = node;
            memory.reentry_mode = mode;
            TY_(pushMemory)( doc, memory );
            return node;
        }

        TY_(InsertNodeAtEnd)(element, node);
    } /* while */

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
    return NULL;
}